

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

file_format_t __thiscall
cfgfile::details::determine_format_t<cfgfile::string_trait_t>::format
          (determine_format_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  int iVar2;
  ulong in_RAX;
  char_t ch;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if ((format()::xml == '\0') && (iVar2 = __cxa_guard_acquire(&format()::xml), iVar2 != 0)) {
    format::xml = '<';
    __cxa_guard_release(&format()::xml);
  }
  uStack_18 = uStack_18 & 0xffffffffffffff;
  do {
    bVar1 = string_trait_t::is_at_end(this->m_stream);
    if (bVar1) {
      return cfgfile_format;
    }
    std::operator>>(this->m_stream,(char *)((long)&uStack_18 + 7));
    bVar1 = string_trait_t::is_space(uStack_18._7_1_);
  } while (bVar1);
  return (uint)(uStack_18._7_1_ == format::xml);
}

Assistant:

file_format_t format()
	{
		static const typename Trait::char_t xml = Trait::from_ascii( '<' );

		typename Trait::char_t ch( 0x00 );

		while( !Trait::is_at_end( m_stream ) )
		{
			m_stream >> ch;

			if( Trait::is_space( ch ) )
				continue;

			if( ch == xml )
				return file_format_t::xml_format;
			else
				return file_format_t::cfgfile_format;
		}

		return file_format_t::cfgfile_format;
	}